

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service.cxx
# Opt level: O0

void __thiscall nuraft::asio_rpc_client::close_socket(asio_rpc_client *this)

{
  asio_rpc_client *this_local;
  
  return;
}

Assistant:

void close_socket() {
        // Do nothing,
        // early closing socket before destroying this instance
        // may cause problem, especially when SSL is enabled.
#if 0
        if (socket().is_open()) {
            std::unique_lock<std::mutex> l(socket_lock_, std::try_to_lock);
            if (l.owns_lock() && socket().is_open()) {
                socket().close();
                p_db("socket to %s:%s closed", host_.c_str(), port_.c_str());
            } else {
                p_wn("race: socket to %s:%s is already closed",
                     host_.c_str(), port_.c_str());
            }
        }
#endif
    }